

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdNode.cpp
# Opt level: O3

KdNode * KdNode::build(vector<Triangle,_std::allocator<Triangle>_> *triangles,
                      vector<float,_std::allocator<float>_> *ranges,int depth)

{
  int iVar1;
  int iVar2;
  pointer pfVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  KdNode *pKVar13;
  KdNode *pKVar14;
  iterator __begin1;
  pointer __args;
  int iVar15;
  ulong uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  undefined1 auStack_78 [8];
  vector<Triangle,_std::allocator<Triangle>_> rightTrs;
  undefined1 auStack_58 [8];
  vector<Triangle,_std::allocator<Triangle>_> leftTrs;
  iterator __end1;
  
  __args = (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
           super__Vector_impl_data._M_start;
  leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (triangles->super__Vector_base<Triangle,_std::allocator<Triangle>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  uVar16 = (long)leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage - (long)__args;
  if (leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage == __args) {
    pKVar13 = (KdNode *)0x0;
  }
  else {
    pKVar13 = (KdNode *)operator_new(0x30);
    *(undefined8 *)pKVar13 = 0;
    pKVar13->left = (KdNode *)0x0;
    pKVar13->right = (KdNode *)0x0;
    (pKVar13->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (pKVar13->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (pKVar13->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (depth < 0x15 && 0x27f < uVar16) {
      auStack_58 = (undefined1  [8])0x0;
      leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_78 = (undefined1  [8])0x0;
      rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      iVar15 = depth % 3;
      iVar1 = iVar15 * 2;
      pfVar3 = (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar2 = iVar15 * 2 + 1;
      fVar17 = (pfVar3[iVar1] + pfVar3[iVar2]) * 0.5;
      do {
        if (iVar15 == 2) {
          fVar18 = (__args->y).z;
          fVar19 = (__args->x).z;
          if (fVar19 <= fVar18) {
            fVar18 = fVar19;
          }
          fVar19 = (__args->z).z;
          if (fVar18 <= fVar19) {
            fVar19 = fVar18;
          }
          if (fVar19 <= fVar17) {
            if (leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start ==
                leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                        ((vector<Triangle,std::allocator<Triangle>> *)auStack_58,
                         (iterator)
                         leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                         super__Vector_impl_data._M_start,__args);
            }
            else {
              fVar11 = (__args->x).x;
              fVar12 = (__args->x).y;
              uVar4 = *(undefined8 *)&(__args->x).z;
              fVar19 = (__args->y).y;
              fVar8 = (__args->y).z;
              fVar9 = (__args->z).x;
              fVar10 = (__args->z).y;
              uVar5 = *(undefined8 *)&(__args->z).z;
              uVar6 = *(undefined8 *)&(__args->colorY).g;
              fVar18 = (__args->normal).y;
              uVar7 = *(undefined8 *)&(__args->normal).z;
              ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->normal).x = (__args->normal).x;
              ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->normal).y = fVar18;
              *(undefined8 *)
               &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).z = uVar7;
              *(undefined8 *)
               &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).z = uVar5;
              *(undefined8 *)
               &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->colorY).g = uVar6;
              ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->y).y = fVar19;
              ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->y).z = fVar8;
              ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->z).x = fVar9;
              ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->z).y = fVar10;
              ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->x).x = fVar11;
              ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->x).y = fVar12;
              *(undefined8 *)
               &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).z = uVar4;
              leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
              super__Vector_impl_data._M_start =
                   leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
          fVar18 = (__args->y).z;
          fVar19 = (__args->x).z;
          if (fVar18 <= fVar19) {
            fVar18 = fVar19;
          }
          fVar19 = (__args->z).z;
LAB_00104944:
          if (fVar19 <= fVar18) {
            fVar19 = fVar18;
          }
          if (fVar17 < fVar19) {
            if (rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start ==
                rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                        ((vector<Triangle,std::allocator<Triangle>> *)auStack_78,
                         (iterator)
                         rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                         super__Vector_impl_data._M_start,__args);
            }
            else {
              fVar11 = (__args->x).x;
              fVar12 = (__args->x).y;
              uVar4 = *(undefined8 *)&(__args->x).z;
              fVar19 = (__args->y).y;
              fVar8 = (__args->y).z;
              fVar9 = (__args->z).x;
              fVar10 = (__args->z).y;
              uVar5 = *(undefined8 *)&(__args->z).z;
              uVar6 = *(undefined8 *)&(__args->colorY).g;
              fVar18 = (__args->normal).y;
              uVar7 = *(undefined8 *)&(__args->normal).z;
              ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->normal).x = (__args->normal).x;
              ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->normal).y = fVar18;
              *(undefined8 *)
               &((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).z = uVar7;
              *(undefined8 *)
               &((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).z = uVar5;
              *(undefined8 *)
               &((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->colorY).g = uVar6;
              ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->y).y = fVar19;
              ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->y).z = fVar8;
              ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->z).x = fVar9;
              ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->z).y = fVar10;
              ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->x).x = fVar11;
              ((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start)->x).y = fVar12;
              *(undefined8 *)
               &((rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).z = uVar4;
              rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
              super__Vector_impl_data._M_start =
                   rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                   super__Vector_impl_data._M_start + 1;
            }
          }
        }
        else {
          if (iVar15 == 1) {
            fVar18 = (__args->y).y;
            fVar19 = (__args->x).y;
            if (fVar19 <= fVar18) {
              fVar18 = fVar19;
            }
            fVar19 = (__args->z).y;
            if (fVar18 <= fVar19) {
              fVar19 = fVar18;
            }
            if (fVar19 <= fVar17) {
              if (leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                          ((vector<Triangle,std::allocator<Triangle>> *)auStack_58,
                           (iterator)
                           leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_start,__args);
              }
              else {
                fVar11 = (__args->x).x;
                fVar12 = (__args->x).y;
                uVar4 = *(undefined8 *)&(__args->x).z;
                fVar19 = (__args->y).y;
                fVar8 = (__args->y).z;
                fVar9 = (__args->z).x;
                fVar10 = (__args->z).y;
                uVar5 = *(undefined8 *)&(__args->z).z;
                uVar6 = *(undefined8 *)&(__args->colorY).g;
                fVar18 = (__args->normal).y;
                uVar7 = *(undefined8 *)&(__args->normal).z;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).x = (__args->normal).x;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).y = fVar18;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->normal).z = uVar7;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->z).z = uVar5;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->colorY).g = uVar6;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->y).y = fVar19;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->y).z = fVar8;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).x = fVar9;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).y = fVar10;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).x = fVar11;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).y = fVar12;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->x).z = uVar4;
                leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start =
                     leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
            fVar18 = (__args->y).y;
            fVar19 = (__args->x).y;
            if (fVar18 <= fVar19) {
              fVar18 = fVar19;
            }
            fVar19 = (__args->z).y;
            goto LAB_00104944;
          }
          if (iVar15 == 0) {
            fVar18 = (__args->y).x;
            fVar19 = (__args->x).x;
            if (fVar19 <= fVar18) {
              fVar18 = fVar19;
            }
            fVar19 = (__args->z).x;
            if (fVar18 <= fVar19) {
              fVar19 = fVar18;
            }
            if (fVar19 <= fVar17) {
              if (leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start ==
                  leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
                std::vector<Triangle,std::allocator<Triangle>>::_M_realloc_insert<Triangle_const&>
                          ((vector<Triangle,std::allocator<Triangle>> *)auStack_58,
                           (iterator)
                           leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                           super__Vector_impl_data._M_start,__args);
              }
              else {
                fVar11 = (__args->x).x;
                fVar12 = (__args->x).y;
                uVar4 = *(undefined8 *)&(__args->x).z;
                fVar19 = (__args->y).y;
                fVar8 = (__args->y).z;
                fVar9 = (__args->z).x;
                fVar10 = (__args->z).y;
                uVar5 = *(undefined8 *)&(__args->z).z;
                uVar6 = *(undefined8 *)&(__args->colorY).g;
                fVar18 = (__args->normal).y;
                uVar7 = *(undefined8 *)&(__args->normal).z;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).x = (__args->normal).x;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->normal).y = fVar18;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->normal).z = uVar7;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->z).z = uVar5;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->colorY).g = uVar6;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->y).y = fVar19;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->y).z = fVar8;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).x = fVar9;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->z).y = fVar10;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).x = fVar11;
                ((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                  super__Vector_impl_data._M_start)->x).y = fVar12;
                *(undefined8 *)
                 &((leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                    super__Vector_impl_data._M_start)->x).z = uVar4;
                leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                super__Vector_impl_data._M_start =
                     leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                     super__Vector_impl_data._M_start + 1;
              }
            }
            fVar18 = (__args->y).x;
            fVar19 = (__args->x).x;
            if (fVar18 <= fVar19) {
              fVar18 = fVar19;
            }
            fVar19 = (__args->z).x;
            goto LAB_00104944;
          }
        }
        __args = __args + 1;
      } while (__args != leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
      pfVar3 = (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,pfVar3[iVar1]);
      pKVar13->plane = fVar17;
      pfVar3[iVar1] = fVar17;
      pKVar14 = build((vector<Triangle,_std::allocator<Triangle>_> *)auStack_78,ranges,depth + 1);
      pKVar13->right = pKVar14;
      pfVar3 = (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar3[iVar1] =
           leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_;
      leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)CONCAT44(leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl
                             .super__Vector_impl_data._M_end_of_storage._4_4_,pfVar3[iVar2]);
      pfVar3[iVar2] = fVar17;
      pKVar14 = build((vector<Triangle,_std::allocator<Triangle>_> *)auStack_58,ranges,depth + 1);
      pKVar13->left = pKVar14;
      (ranges->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
      _M_start[iVar2] =
           leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage._0_4_;
      if (auStack_78 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_78,
                        (long)rightTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_78);
      }
      if (auStack_58 != (undefined1  [8])0x0) {
        operator_delete((void *)auStack_58,
                        (long)leftTrs.super__Vector_base<Triangle,_std::allocator<Triangle>_>.
                              _M_impl.super__Vector_impl_data._M_finish - (long)auStack_58);
      }
    }
    else {
      std::vector<Triangle,_std::allocator<Triangle>_>::operator=(&pKVar13->triangles,triangles);
    }
  }
  return pKVar13;
}

Assistant:

KdNode* KdNode::build(std::vector<Triangle>& triangles, std::vector<float> &ranges, int depth)
{
  if (triangles.size() == 0)
    return nullptr;

  KdNode* node = new KdNode();

  if (triangles.size() < 10 || depth > 20)
  {
    node->triangles = triangles;
    return node;
  }

  std::vector<Triangle> leftTrs;
  std::vector<Triangle> rightTrs;

  int axis = depth % 3;

  float midValue = (ranges[axis*2] + ranges[axis*2+1]) / 2;
  for (auto const& triangle : triangles)
  {
    switch (axis)
    {
      case 0:
        if(getMinPoint(triangle).x <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).x > midValue)
            rightTrs.push_back(triangle);
        break;
      case 1:
        if(getMinPoint(triangle).y <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).y > midValue)
            rightTrs.push_back(triangle);
        break;
      case 2:
        if(getMinPoint(triangle).z <= midValue)
            leftTrs.push_back(triangle);
        if(getMaxPoint(triangle).z > midValue)
            rightTrs.push_back(triangle);
        break;
    }
  }

  node->plane = midValue;

  float tmp = ranges[axis*2];
  ranges[axis*2] = midValue;
  node->right = KdNode::build(rightTrs, ranges, depth+1);
  ranges[axis*2] = tmp;
  tmp = ranges[axis*2+1];
  ranges[axis*2+1] = midValue;
  node->left = KdNode::build(leftTrs, ranges, depth+1);
  ranges[axis*2+1] = tmp;

  return node;
}